

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_utils.cpp
# Opt level: O2

void HydroUtils::EB_ComputeFluxes
               (Box *bx,Array4<double> *fx,Array4<double> *fy,Array4<double> *fz,
               Array4<const_double> *umac,Array4<const_double> *vmac,Array4<const_double> *wmac,
               Array4<const_double> *xed,Array4<const_double> *yed,Array4<const_double> *zed,
               Array4<const_double> *apx,Array4<const_double> *apy,Array4<const_double> *apz,
               Geometry *geom,int ncomp,Array4<const_amrex::EBCellFlag> *flag,
               bool fluxes_are_area_weighted)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  double *pdVar15;
  long lVar16;
  long lVar17;
  double *pdVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  EBCellFlag *pEVar22;
  ulong uVar23;
  EBCellFlag *pEVar24;
  EBCellFlag *pEVar25;
  double *pdVar26;
  double *pdVar27;
  long lVar28;
  double *pdVar29;
  ulong uVar30;
  int j_1;
  long lVar31;
  double *pdVar32;
  double *pdVar33;
  int iVar34;
  long lVar35;
  long lVar36;
  double *pdVar37;
  double *pdVar38;
  long lVar39;
  long lVar40;
  double *pdVar41;
  double *pdVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  int j;
  double *pdVar46;
  long lVar47;
  long lVar48;
  long lVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  
  dVar50 = (geom->super_CoordSys).dx[0];
  dVar52 = (geom->super_CoordSys).dx[1];
  if (fluxes_are_area_weighted) {
    dVar51 = (geom->super_CoordSys).dx[2];
    dVar53 = dVar52 * dVar51;
    dVar51 = dVar51 * dVar50;
  }
  else {
    dVar53 = 1.0;
    dVar51 = 1.0;
  }
  iVar1 = (bx->smallend).vect[0];
  lVar39 = (long)iVar1;
  lVar48 = (long)(bx->smallend).vect[1];
  lVar43 = (long)(bx->smallend).vect[2];
  uVar2 = (bx->btype).itype;
  iVar34 = (~uVar2 & 1) + (bx->bigend).vect[0];
  lVar11 = fx->jstride;
  uVar30 = (ulong)(uint)ncomp;
  if (ncomp < 1) {
    uVar30 = 0;
  }
  lVar12 = fx->kstride;
  iVar3 = (apx->begin).z;
  iVar4 = (apx->begin).y;
  lVar13 = apx->kstride;
  lVar14 = apx->jstride;
  iVar5 = (apx->begin).x;
  pdVar15 = apx->p;
  iVar6 = (umac->begin).z;
  iVar7 = (umac->begin).y;
  lVar16 = umac->kstride;
  lVar17 = umac->jstride;
  iVar8 = (umac->begin).x;
  pdVar18 = umac->p;
  lVar19 = xed->kstride;
  lVar31 = xed->jstride;
  lVar28 = (long)(flag->begin).z;
  lVar20 = flag->kstride;
  lVar36 = (long)(flag->begin).y;
  lVar21 = flag->jstride;
  pdVar29 = fx->p + ((lVar39 + (lVar43 - (fx->begin).z) * lVar12 + (lVar48 - (fx->begin).y) * lVar11
                     ) - (long)(fx->begin).x);
  lVar45 = fx->nstride;
  pdVar26 = xed->p + ((lVar39 + (lVar43 - (xed->begin).z) * lVar19 +
                                (lVar48 - (xed->begin).y) * lVar31) - (long)(xed->begin).x);
  lVar49 = xed->nstride;
  pEVar22 = flag->p;
  lVar40 = (long)(flag->begin).x;
  iVar9 = (bx->bigend).vect[1];
  iVar10 = (bx->bigend).vect[2];
  for (uVar23 = 0;
      pEVar24 = pEVar22 + ((lVar39 + (lVar43 - lVar28) * lVar20 + (lVar48 - lVar36) * lVar21) -
                          lVar40), pdVar32 = pdVar26, lVar35 = lVar43,
      pdVar37 = pdVar18 + ((lVar39 + (lVar43 - iVar6) * lVar16 + (lVar48 - iVar7) * lVar17) -
                          (long)iVar8),
      pdVar42 = pdVar15 + ((lVar39 + (lVar43 - iVar3) * lVar13 + (lVar48 - iVar4) * lVar14) -
                          (long)iVar5), pdVar46 = pdVar29, uVar23 != uVar30; uVar23 = uVar23 + 1) {
    for (; pdVar27 = pdVar32, pdVar33 = pdVar46, pdVar38 = pdVar37, pdVar41 = pdVar42,
        lVar47 = lVar48, pEVar25 = pEVar24, lVar35 <= iVar10; lVar35 = lVar35 + 1) {
      for (; lVar47 <= iVar9; lVar47 = lVar47 + 1) {
        if (iVar1 <= iVar34) {
          lVar44 = 0;
          do {
            dVar54 = 0.0;
            if ((pEVar25[lVar44].flag & 0x20000) != 0) {
              dVar54 = pdVar27[lVar44] * pdVar38[lVar44] * pdVar41[lVar44] * dVar53;
            }
            pdVar33[lVar44] = dVar54;
            lVar44 = lVar44 + 1;
          } while ((iVar34 - iVar1) + 1 != (int)lVar44);
        }
        pdVar33 = pdVar33 + lVar11;
        pdVar41 = pdVar41 + lVar14;
        pdVar38 = pdVar38 + lVar17;
        pdVar27 = pdVar27 + lVar31;
        pEVar25 = pEVar25 + lVar21;
      }
      pEVar24 = pEVar24 + lVar20;
      pdVar32 = pdVar32 + lVar19;
      pdVar37 = pdVar37 + lVar16;
      pdVar42 = pdVar42 + lVar13;
      pdVar46 = pdVar46 + lVar12;
    }
    pdVar29 = pdVar29 + lVar45;
    pdVar26 = pdVar26 + lVar49;
  }
  iVar1 = (bx->smallend).vect[0];
  lVar31 = (long)iVar1;
  lVar49 = (long)(bx->smallend).vect[1];
  iVar34 = (bx->bigend).vect[1];
  lVar45 = (long)(bx->smallend).vect[2];
  iVar3 = (vmac->begin).y;
  lVar11 = apy->jstride;
  iVar4 = (apy->begin).y;
  iVar5 = (apy->begin).z;
  lVar39 = apy->kstride;
  iVar6 = (apy->begin).x;
  iVar7 = (vmac->begin).z;
  pdVar15 = apy->p;
  lVar43 = vmac->kstride;
  lVar48 = vmac->jstride;
  iVar8 = (vmac->begin).x;
  pdVar18 = vmac->p;
  lVar12 = fy->kstride;
  lVar13 = fy->jstride;
  lVar14 = yed->kstride;
  lVar16 = yed->jstride;
  dVar50 = dVar50 * dVar52;
  pdVar26 = fy->p + ((lVar31 + (lVar45 - (fy->begin).z) * lVar12 + (lVar49 - (fy->begin).y) * lVar13
                     ) - (long)(fy->begin).x);
  lVar17 = fy->nstride;
  pdVar29 = yed->p + ((lVar31 + (lVar45 - (yed->begin).z) * lVar14 +
                                (lVar49 - (yed->begin).y) * lVar16) - (long)(yed->begin).x);
  lVar19 = yed->nstride;
  iVar9 = (bx->bigend).vect[0];
  iVar10 = (bx->bigend).vect[2];
  for (uVar23 = 0;
      pEVar24 = pEVar22 + ((lVar31 + (lVar45 - lVar28) * lVar20 + (lVar49 - lVar36) * lVar21) -
                          lVar40), pdVar32 = pdVar26, lVar35 = lVar45, pdVar37 = pdVar29,
      pdVar42 = pdVar18 + ((lVar31 + (lVar45 - iVar7) * lVar43 + (lVar49 - iVar3) * lVar48) -
                          (long)iVar8),
      pdVar46 = pdVar15 + ((lVar31 + (lVar45 - iVar5) * lVar39 + (lVar49 - iVar4) * lVar11) -
                          (long)iVar6), uVar23 != uVar30; uVar23 = uVar23 + 1) {
    for (; pEVar25 = pEVar24, pdVar27 = pdVar42, lVar47 = lVar49, pdVar33 = pdVar32,
        pdVar38 = pdVar37, pdVar41 = pdVar46, lVar35 <= iVar10; lVar35 = lVar35 + 1) {
      for (; lVar47 <= (int)(iVar34 + (uint)((uVar2 & 2) == 0)); lVar47 = lVar47 + 1) {
        if (iVar1 <= iVar9) {
          lVar44 = 0;
          do {
            dVar52 = 0.0;
            if ((pEVar25[lVar44].flag & 0x8000) != 0) {
              dVar52 = pdVar38[lVar44] * pdVar27[lVar44] * pdVar41[lVar44] * dVar51;
            }
            pdVar33[lVar44] = dVar52;
            lVar44 = lVar44 + 1;
          } while ((iVar9 - iVar1) + 1 != (int)lVar44);
        }
        pdVar33 = pdVar33 + lVar13;
        pdVar41 = pdVar41 + lVar11;
        pdVar27 = pdVar27 + lVar48;
        pdVar38 = pdVar38 + lVar16;
        pEVar25 = pEVar25 + lVar21;
      }
      pEVar24 = pEVar24 + lVar20;
      pdVar32 = pdVar32 + lVar12;
      pdVar37 = pdVar37 + lVar14;
      pdVar42 = pdVar42 + lVar43;
      pdVar46 = pdVar46 + lVar39;
    }
    pdVar26 = pdVar26 + lVar17;
    pdVar29 = pdVar29 + lVar19;
  }
  if (!fluxes_are_area_weighted) {
    dVar50 = 1.0;
  }
  lVar45 = (long)(bx->smallend).vect[1];
  iVar1 = (bx->bigend).vect[2];
  lVar49 = (long)(bx->smallend).vect[2];
  lVar11 = fz->kstride;
  lVar39 = fz->jstride;
  iVar34 = (bx->smallend).vect[0];
  lVar31 = (long)iVar34;
  iVar3 = (apz->begin).z;
  iVar4 = (apz->begin).y;
  lVar43 = apz->kstride;
  lVar48 = apz->jstride;
  iVar5 = (apz->begin).x;
  pdVar15 = apz->p;
  iVar6 = (wmac->begin).z;
  iVar7 = (wmac->begin).y;
  lVar12 = wmac->kstride;
  lVar13 = wmac->jstride;
  iVar8 = (wmac->begin).x;
  pdVar18 = wmac->p;
  lVar14 = zed->kstride;
  lVar16 = zed->jstride;
  pdVar26 = fz->p + ((lVar31 + (lVar49 - (fz->begin).z) * lVar11 + (lVar45 - (fz->begin).y) * lVar39
                     ) - (long)(fz->begin).x);
  iVar9 = (bx->bigend).vect[0];
  iVar10 = (bx->bigend).vect[1];
  lVar17 = fz->nstride;
  pdVar29 = zed->p + ((lVar31 + (lVar49 - (zed->begin).z) * lVar14 +
                                (lVar45 - (zed->begin).y) * lVar16) - (long)(zed->begin).x);
  lVar19 = zed->nstride;
  for (uVar23 = 0; pdVar32 = pdVar26,
      pEVar24 = pEVar22 + ((lVar31 + lVar20 * (lVar49 - lVar28) + lVar21 * (lVar45 - lVar36)) -
                          lVar40), pdVar37 = pdVar29,
      pdVar42 = pdVar18 + ((lVar31 + (lVar49 - iVar6) * lVar12 + (lVar45 - iVar7) * lVar13) -
                          (long)iVar8), lVar35 = lVar49,
      pdVar46 = pdVar15 + ((lVar31 + (lVar49 - iVar3) * lVar43 + (lVar45 - iVar4) * lVar48) -
                          (long)iVar5), uVar23 != uVar30; uVar23 = uVar23 + 1) {
    for (; pdVar27 = pdVar42, pEVar25 = pEVar24, pdVar33 = pdVar32, lVar47 = lVar45,
        pdVar38 = pdVar37, pdVar41 = pdVar46, lVar35 <= (int)(iVar1 + (uint)((uVar2 & 4) == 0));
        lVar35 = lVar35 + 1) {
      for (; lVar47 <= iVar10; lVar47 = lVar47 + 1) {
        if (iVar34 <= iVar9) {
          lVar44 = 0;
          do {
            dVar52 = 0.0;
            if ((pEVar25[lVar44].flag & 0x200) != 0) {
              dVar52 = pdVar38[lVar44] * pdVar27[lVar44] * pdVar41[lVar44] * dVar50;
            }
            pdVar33[lVar44] = dVar52;
            lVar44 = lVar44 + 1;
          } while ((iVar9 - iVar34) + 1 != (int)lVar44);
        }
        pdVar33 = pdVar33 + lVar39;
        pdVar41 = pdVar41 + lVar48;
        pdVar27 = pdVar27 + lVar13;
        pdVar38 = pdVar38 + lVar16;
        pEVar25 = pEVar25 + lVar21;
      }
      pdVar32 = pdVar32 + lVar11;
      pEVar24 = pEVar24 + lVar20;
      pdVar37 = pdVar37 + lVar14;
      pdVar42 = pdVar42 + lVar12;
      pdVar46 = pdVar46 + lVar43;
    }
    pdVar26 = pdVar26 + lVar17;
    pdVar29 = pdVar29 + lVar19;
  }
  return;
}

Assistant:

void
HydroUtils::EB_ComputeFluxes ( Box const& bx,
                               AMREX_D_DECL( Array4<Real> const& fx,
                                             Array4<Real> const& fy,
                                             Array4<Real> const& fz),
                               AMREX_D_DECL( Array4<Real const> const& umac,
                                             Array4<Real const> const& vmac,
                                             Array4<Real const> const& wmac),
                               AMREX_D_DECL( Array4<Real const> const& xed,
                                             Array4<Real const> const& yed,
                                             Array4<Real const> const& zed),
                               AMREX_D_DECL( Array4<Real const> const& apx,
                                             Array4<Real const> const& apy,
                                             Array4<Real const> const& apz),
                               Geometry const& geom, const int ncomp,
                               Array4<EBCellFlag const> const& flag,
                               const bool fluxes_are_area_weighted )
{

    const auto dx = geom.CellSizeArray();

    GpuArray<Real,AMREX_SPACEDIM> area;

#if ( AMREX_SPACEDIM == 3 )
    if (fluxes_are_area_weighted)
    {
        area[0] = dx[1]*dx[2];
        area[1] = dx[0]*dx[2];
        area[2] = dx[0]*dx[1];
    } else {
        area[0] = 1.; area[1] = 1.; area[2] = 1.;
    }
#else
    if (fluxes_are_area_weighted)
    {
        area[0] = dx[1];
        area[1] = dx[0];
    } else {
        area[0] = 1.; area[1] = 1.;
    }
#endif

    //
    //  X flux
    //
    const Box& xbx = amrex::surroundingNodes(bx,0);

    amrex::ParallelFor(xbx, ncomp, [fx, umac, xed, area, apx, flag]
    AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
    {
        if (flag(i,j,k).isConnected(-1,0,0))
            fx(i,j,k,n) = xed(i,j,k,n) * umac(i,j,k) * apx(i,j,k) * area[0];
        else
            fx(i,j,k,n) = 0.;
    });

    //
    //  y flux
    //
    const Box& ybx = amrex::surroundingNodes(bx,1);

    amrex::ParallelFor(ybx, ncomp, [fy, vmac, yed, area, apy, flag]
    AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
    {
        if (flag(i,j,k).isConnected(0,-1,0))
            fy(i,j,k,n) = yed(i,j,k,n) * vmac(i,j,k) * apy(i,j,k) * area[1];
        else
            fy(i,j,k,n) = 0.;
    });

#if (AMREX_SPACEDIM==3)
    //
    //  z flux
    //
    const Box& zbx = amrex::surroundingNodes(bx,2);

    amrex::ParallelFor(zbx, ncomp, [fz, wmac, zed, area, apz, flag]
    AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
    {
        if (flag(i,j,k).isConnected(0,0,-1))
            fz(i,j,k,n) = zed(i,j,k,n) * wmac(i,j,k) * apz(i,j,k) * area[2];
        else
            fz(i,j,k,n) = 0.;
    });
#endif

}